

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFront.h
# Opt level: O0

void __thiscall
TPZFront<std::complex<long_double>_>::STensorProductMTData::Run
          (STensorProductMTData *this,TPZVec<std::complex<long_double>_> *AuxVecCol,
          TPZVec<std::complex<long_double>_> *AuxVecRow)

{
  int iVar1;
  undefined8 in_RDX;
  TPZSemaphore *in_RSI;
  long in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  int iVar3;
  
  *(TPZSemaphore **)(in_RDI + 200) = in_RSI;
  *(undefined8 *)(in_RDI + 0xd0) = in_RDX;
  *(undefined4 *)(in_RDI + 0x60) = 0;
  iVar2 = 0;
  while( true ) {
    iVar3 = iVar2;
    iVar1 = NThreads((STensorProductMTData *)0x1ccdae6);
    if (iVar1 <= iVar2) break;
    TPZVec<TPZSemaphore>::operator[]((TPZVec<TPZSemaphore> *)(in_RDI + 0x90),(long)iVar3);
    TPZSemaphore::Post(in_RSI);
    iVar2 = iVar3 + 1;
  }
  TPZSemaphore::Wait((TPZSemaphore *)CONCAT44(iVar3,in_stack_ffffffffffffffe0));
  return;
}

Assistant:

void Run(TPZVec<TVar> &AuxVecCol, TPZVec<TVar> &AuxVecRow){
			this->fAuxVecCol = &AuxVecCol;
			this->fAuxVecRow = &AuxVecRow;
			this->fWorkDoneCount = 0;
			for(int i = 0; i < NThreads(); i++){
				fWorkSem[i].Post();
			}
      fWorkDoneSem.Wait();
		}